

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexjson.h
# Opt level: O2

ssize_t read(int __fd,void *__buf,size_t __nbytes)

{
  undefined4 in_register_0000003c;
  undefined1 auStack_38 [40];
  
  json_deserializer::json_reader::json_reader((json_reader *)auStack_38,(string *)__buf);
  json_deserializer::deserialize
            ((json_object *)CONCAT44(in_register_0000003c,__fd),(json_deserializer *)auStack_38);
  std::__cxx11::string::~string((string *)(auStack_38 + 8));
  return (ssize_t)(json_object *)CONCAT44(in_register_0000003c,__fd);
}

Assistant:

json_object read(string value) {
    return json_deserializer(value).deserialize();
}